

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

void __thiscall ON_OBSOLETE_V5_Annotation::Destroy(ON_OBSOLETE_V5_Annotation *this)

{
  ON_OBSOLETE_V5_Annotation *this_local;
  
  this->m_v5_3dm_archive_dimstyle_index = -1;
  ON_SimpleArray<ON_2dPoint>::Empty(&(this->m_points).super_ON_SimpleArray<ON_2dPoint>);
  SetTextValue(this,(wchar_t *)0x0);
  SetTextFormula(this,(wchar_t *)0x0);
  this->m_type = dtNothing;
  memcpy(&this->m_plane,&ON_xy_plane,0x80);
  this->m_userpositionedtext = false;
  this->m_justification = 0;
  this->m_annotative_scale = true;
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::Destroy()
{
  m_v5_3dm_archive_dimstyle_index = -1;

  // 10-27-03 LW memory leak prevention
  m_points.Empty();
  SetTextValue(0);
  SetTextFormula(0);
  m_type = ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtNothing;
  m_plane = ON_xy_plane;
  m_userpositionedtext = false;
  m_justification = 0;
  m_annotative_scale = true;
}